

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::flatten_buffer_block(CompilerGLSL *this,VariableID id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  uint32_t local_108;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [39];
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [39];
  undefined1 local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [39];
  undefined1 local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [52];
  uint32_t local_54;
  Bitset *local_50;
  Bitset *flags;
  string name;
  SPIRType *type;
  SPIRVariable *var;
  CompilerGLSL *this_local;
  VariableID id_local;
  
  this_local._4_4_ = id.id;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar3 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar3->super_IVariant).field_0xc);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar4->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(&flags,this,(ulong)uVar2,0);
  local_54 = (pSVar4->super_IVariant).self.id;
  local_50 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)local_54);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    local_89 = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(local_88,(char *)&flags);
    CompilerError::CompilerError(pCVar5,local_88);
    local_89 = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (*(int *)&(pSVar4->super_IVariant).field_0xc != 0xf) {
    local_b1 = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(local_b0,(char *)&flags);
    CompilerError::CompilerError(pCVar5,local_b0);
    local_b1 = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = Bitset::get(local_50,2);
  if (!bVar1) {
    local_d9 = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::operator+(local_d8,(char *)&flags);
    CompilerError::CompilerError(pCVar5,local_d8);
    local_d9 = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                    (&(pSVar4->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (!bVar1) {
    local_108 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->flattened_buffer_blocks,&local_108);
    ::std::__cxx11::string::~string((string *)&flags);
    return;
  }
  local_101 = 1;
  pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::operator+(local_100,(char *)&flags);
  CompilerError::CompilerError(pCVar5,local_100);
  local_101 = 0;
  __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerGLSL::flatten_buffer_block(VariableID id)
{
	auto &var = get<SPIRVariable>(id);
	auto &type = get<SPIRType>(var.basetype);
	auto name = to_name(type.self, false);
	auto &flags = get_decoration_bitset(type.self);

	if (!type.array.empty())
		SPIRV_CROSS_THROW(name + " is an array of UBOs.");
	if (type.basetype != SPIRType::Struct)
		SPIRV_CROSS_THROW(name + " is not a struct.");
	if (!flags.get(DecorationBlock))
		SPIRV_CROSS_THROW(name + " is not a block.");
	if (type.member_types.empty())
		SPIRV_CROSS_THROW(name + " is an empty struct.");

	flattened_buffer_blocks.insert(id);
}